

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_multi_extent.c
# Opt level: O1

void test_read_format_iso_multi_extent(void)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  archive_conflict *a;
  char *pcVar5;
  long v2;
  la_int64_t lVar6;
  time_t tVar7;
  stat *psVar8;
  longlong v2_00;
  char *e2;
  archive_entry *ae;
  int64_t offset;
  size_t size;
  void *p;
  archive_conflict *extra;
  archive_entry *local_50;
  longlong local_48;
  int local_40 [2];
  void *local_38;
  
  extract_reference_file("test_read_format_iso_multi_extent.iso.Z");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                   ,L'\'',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                      ,L'(',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                      ,L')',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename(a,"test_read_format_iso_multi_extent.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                      ,L'+',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = 1;
  do {
    iVar3 = archive_read_next_header((archive *)a,&local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                        ,L'0',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",(void *)0x0);
    pcVar5 = archive_entry_pathname(local_50);
    iVar3 = strcmp(".",pcVar5);
    if (iVar3 == 0) {
      mVar4 = archive_entry_filetype(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'4',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar6 = archive_entry_size(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'5',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
      tVar7 = archive_entry_mtime(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'6',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'7',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'8',2,"2",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                          (void *)0x0);
      lVar6 = archive_entry_uid(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'9',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
      iVar3 = archive_read_data_block((archive *)a,&local_38,(size_t *)local_40,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L';',1,"ARCHIVE_EOF",(long)iVar3,
                          "archive_read_data_block(a, &p, &size, &offset)",a);
      extra = (archive_conflict *)0x0;
      wVar2 = L'<';
      pcVar5 = "(int)size";
      v2_00 = 0;
      e2 = "0";
      iVar3 = local_40[0];
LAB_0016f98a:
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,wVar2,(long)iVar3,pcVar5,v2_00,e2,extra);
    }
    else {
      pcVar5 = archive_entry_pathname(local_50);
      iVar3 = strcmp("file",pcVar5);
      if (iVar3 == 0) {
        pcVar5 = archive_entry_pathname(local_50);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                   ,L'?',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar4 = archive_entry_filetype(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'@',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar6 = archive_entry_size(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'A',0x40088,"262280",lVar6,"archive_entry_size(ae)",(void *)0x0);
        iVar3 = archive_read_data_block((archive *)a,&local_38,(size_t *)local_40,&local_48);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'C',0,"0",(long)iVar3,"archive_read_data_block(a, &p, &size, &offset)"
                            ,(void *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'D',0,"0",local_48,"offset",(void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'E',local_38,"p","head--head--head","\"head--head--head\"",0x10,"16",
                            (void *)0x0);
        tVar7 = archive_entry_mtime(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'F',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
        tVar7 = archive_entry_atime(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'G',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
        psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'H',1,"1",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                            (void *)0x0);
        lVar6 = archive_entry_uid(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'I',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
        lVar6 = archive_entry_gid(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'J',2,"2",lVar6,"archive_entry_gid(ae)",(void *)0x0);
        wVar2 = archive_entry_is_encrypted(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                            ,L'K',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
        iVar3 = archive_read_has_encrypted_entries((archive *)a);
        wVar2 = L'L';
        pcVar5 = "archive_read_has_encrypted_entries(a)";
        v2_00 = -2;
        e2 = "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED";
        extra = a;
        goto LAB_0016f98a;
      }
      failure("Saw a file that shouldn\'t have been there");
      pcVar5 = archive_entry_pathname(local_50);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                 ,L'O',pcVar5,"archive_entry_pathname(ae)","","\"\"",(void *)0x0,L'\0');
    }
    iVar1 = iVar1 + -1;
    if (iVar1 != 0) {
      iVar1 = archive_read_next_header((archive *)a,&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'T',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          (void *)0x0);
      iVar1 = archive_filter_code((archive *)a,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'W',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                          (void *)0x0);
      iVar1 = archive_format((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'X',(long)iVar1,"archive_format(a)",0x40001,
                          "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
      iVar1 = archive_read_close((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
      iVar1 = archive_read_free((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_iso_multi_extent.c"
                          ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_read_format_iso_multi_extent)
{
	const char *refname = "test_read_format_iso_multi_extent.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 2 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 2; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(262280, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "head--head--head", 16);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
			assertEqualInt(archive_entry_is_encrypted(ae), 0);
			assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}